

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_enlarge_seg(REF_CAVITY ref_cavity,REF_INT seg)

{
  int node0;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_BOOL have_cell1;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_BOOL have_cell0;
  int local_2c;
  REF_INT local_28;
  REF_INT local_24;
  int local_20;
  int local_1c;
  
  if ((-1 < seg) && (seg < ref_cavity->maxseg)) {
    node0 = ref_cavity->s2n[(uint)(seg * 3)];
    if (node0 != -1) {
      uVar1 = ref_cell_list_with2(ref_cavity->ref_grid->cell[3],node0,
                                  ref_cavity->s2n[(ulong)(uint)(seg * 3) + 1],2,&local_20,&local_28)
      ;
      if (uVar1 != 0) {
        pcVar3 = "tri with2";
        uVar2 = 0x7d5;
LAB_001bd933:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar2,"ref_cavity_enlarge_seg",(ulong)uVar1,pcVar3);
        return uVar1;
      }
      if (local_20 != 2) {
        ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
        return 0;
      }
      uVar1 = ref_list_contains(ref_cavity->tri_list,local_28,&local_1c);
      if (uVar1 != 0) {
        pcVar3 = "cell0";
        uVar2 = 0x7dd;
        goto LAB_001bd933;
      }
      uVar1 = ref_list_contains(ref_cavity->tri_list,local_24,&local_2c);
      if (uVar1 != 0) {
        pcVar3 = "cell1";
        uVar2 = 0x7e0;
        goto LAB_001bd933;
      }
      if (local_1c != local_2c) {
        if ((local_1c == 0) || (uVar1 = ref_cavity_add_tri(ref_cavity,local_24), uVar1 == 0)) {
          if (local_2c == 0) {
            return 0;
          }
          uVar1 = ref_cavity_add_tri(ref_cavity,local_28);
          if (uVar1 == 0) {
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x7e3,"ref_cavity_enlarge_seg",(ulong)uVar1,"add c0");
          return uVar1;
        }
        pcVar3 = "add c1";
        uVar2 = 0x7e2;
        goto LAB_001bd933;
      }
      pcVar3 = "cavity same seg-tri state";
      uVar2 = 0x7e1;
      goto LAB_001bd960;
    }
  }
  pcVar3 = "invalid seg";
  uVar2 = 2000;
LAB_001bd960:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar2,
         "ref_cavity_enlarge_seg",pcVar3);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_enlarge_seg(REF_CAVITY ref_cavity, REF_INT seg) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_BOOL have_cell0, have_cell1;
  REF_INT ntri, tri_list[2];

  RAS(ref_cavity_valid_seg(ref_cavity, seg), "invalid seg");

  RSS(ref_cell_list_with2(tri, ref_cavity_s2n(ref_cavity, 0, seg),
                          ref_cavity_s2n(ref_cavity, 1, seg), 2, &ntri,
                          tri_list),
      "tri with2");
  if (2 != ntri) { /* for nonmanifold wirebody */
    ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri_list[0],
                        &have_cell0),
      "cell0");
  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri_list[1],
                        &have_cell1),
      "cell1");
  if (have_cell0 == have_cell1) THROW("cavity same seg-tri state");
  if (have_cell0) RSS(ref_cavity_add_tri(ref_cavity, tri_list[1]), "add c1");
  if (have_cell1) RSS(ref_cavity_add_tri(ref_cavity, tri_list[0]), "add c0");

  return REF_SUCCESS;
}